

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

filepos_t __thiscall
libebml::EbmlMaster::RenderData
          (EbmlMaster *this,IOCallback *output,bool bForceRender,bool bWithDefault)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppEVar3;
  filepos_t fVar4;
  filepos_t fVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  MemIOCallback TmpBuf;
  
  if ((int)CONCAT71(in_register_00000011,bForceRender) == 0) {
    bVar1 = CheckMandatory(this);
    if (!bVar1) {
      __assert_fail("CheckMandatory()",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                    ,0x60,
                    "virtual filepos_t libebml::EbmlMaster::RenderData(IOCallback &, bool, bool)");
    }
  }
  if (this->bChecksumUsed == false) {
    uVar6 = 0;
    fVar5 = 0;
    while( true ) {
      ppEVar3 = (this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->ElementList).
                        super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3) <= uVar6)
      break;
      if (bWithDefault) {
LAB_00191600:
        fVar4 = EbmlElement::Render(ppEVar3[uVar6],output,bWithDefault,false,bForceRender);
        fVar5 = fVar5 + fVar4;
      }
      else {
        iVar2 = (*ppEVar3[uVar6]->_vptr_EbmlElement[0xf])();
        if ((char)iVar2 == '\0') {
          ppEVar3 = (this->ElementList).
                    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00191600;
        }
      }
      uVar6 = uVar6 + 1;
    }
  }
  else {
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    MemIOCallback::MemIOCallback(&TmpBuf,CONCAT44(extraout_var,iVar2) - 6);
    uVar6 = 0;
    while( true ) {
      ppEVar3 = (this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->ElementList).
                        super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3) <= uVar6)
      break;
      if (bWithDefault) {
LAB_001915ab:
        EbmlElement::Render(ppEVar3[uVar6],&TmpBuf.super_IOCallback,bWithDefault,false,bForceRender)
        ;
      }
      else {
        iVar2 = (*ppEVar3[uVar6]->_vptr_EbmlElement[0xf])();
        if ((char)iVar2 == '\0') {
          ppEVar3 = (this->ElementList).
                    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_001915ab;
        }
      }
      uVar6 = uVar6 + 1;
    }
    EbmlCrc32::FillCRC32(&this->Checksum,TmpBuf.dataBuffer,(uint32)TmpBuf.dataBufferTotalSize);
    fVar5 = EbmlElement::Render((EbmlElement *)&this->Checksum,output,true,false,bForceRender);
    IOCallback::writeFully
              (output,TmpBuf.dataBuffer,
               CONCAT44(TmpBuf.dataBufferTotalSize._4_4_,(uint32)TmpBuf.dataBufferTotalSize));
    fVar5 = fVar5 + CONCAT44(TmpBuf.dataBufferTotalSize._4_4_,(uint32)TmpBuf.dataBufferTotalSize);
    MemIOCallback::~MemIOCallback(&TmpBuf);
  }
  return fVar5;
}

Assistant:

filepos_t EbmlMaster::RenderData(IOCallback & output, bool bForceRender, bool bWithDefault)
{
  filepos_t Result = 0;
  size_t Index;

  if (!bForceRender) {
    assert(CheckMandatory());
  }

  if (!bChecksumUsed) { // old school
    for (Index = 0; Index < ElementList.size(); Index++) {
      if (!bWithDefault && (ElementList[Index])->IsDefaultValue())
        continue;
      Result += (ElementList[Index])->Render(output, bWithDefault, false ,bForceRender);
    }
  } else { // new school
    MemIOCallback TmpBuf(GetSize() - 6);
    for (Index = 0; Index < ElementList.size(); Index++) {
      if (!bWithDefault && (ElementList[Index])->IsDefaultValue())
        continue;
      (ElementList[Index])->Render(TmpBuf, bWithDefault, false ,bForceRender);
    }
    Checksum.FillCRC32(TmpBuf.GetDataBuffer(), TmpBuf.GetDataBufferSize());
    Result += Checksum.Render(output, true, false ,bForceRender);
    output.writeFully(TmpBuf.GetDataBuffer(), TmpBuf.GetDataBufferSize());
    Result += TmpBuf.GetDataBufferSize();
  }

  return Result;
}